

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *v,uint weight)

{
  float *pfVar1;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  
  uVar3 = *(undefined8 *)v->m_s;
  uVar4 = *(undefined8 *)(v->m_s + 2);
  uVar5 = *(undefined8 *)(v->m_s + 4);
  uVar6 = *(undefined8 *)(v->m_s + 6);
  uVar7 = *(undefined8 *)(v->m_s + 8);
  uVar8 = *(undefined8 *)(v->m_s + 10);
  uVar9 = *(undefined8 *)(v->m_s + 0xc);
  uVar10 = *(undefined8 *)(v->m_s + 0xe);
  uVar11 = (this->m_training_vecs).m_size;
  if ((this->m_training_vecs).m_capacity <= uVar11) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,uVar11 + 1,true,0x44,
               vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::object_mover,false);
    uVar11 = (this->m_training_vecs).m_size;
  }
  ppVar2 = (this->m_training_vecs).m_p;
  pfVar1 = ppVar2[uVar11].first.m_s + 0xc;
  *(undefined8 *)pfVar1 = uVar9;
  *(undefined8 *)(pfVar1 + 2) = uVar10;
  pfVar1 = ppVar2[uVar11].first.m_s + 8;
  *(undefined8 *)pfVar1 = uVar7;
  *(undefined8 *)(pfVar1 + 2) = uVar8;
  pfVar1 = ppVar2[uVar11].first.m_s + 4;
  *(undefined8 *)pfVar1 = uVar5;
  *(undefined8 *)(pfVar1 + 2) = uVar6;
  *(undefined8 *)ppVar2[uVar11].first.m_s = uVar3;
  *(undefined8 *)(ppVar2[uVar11].first.m_s + 2) = uVar4;
  ppVar2[uVar11].second = weight;
  (this->m_training_vecs).m_size = uVar11 + 1;
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight)
        {
            m_training_vecs.push_back(std::make_pair(v, weight));
        }